

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paint.h
# Opt level: O0

void gimage::drawLine<unsigned_char>
               (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image,long x1,long y1,
               long x2,long y2,float r,float g,float b)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar4;
  long lVar5;
  long lVar6;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RDI;
  long in_R8;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  int c_2;
  int c_1;
  long i_1;
  long n_1;
  long k_1;
  int c;
  long k;
  long n;
  long i;
  long ady;
  long adx;
  long dy;
  long dx;
  int cn;
  uchar v [3];
  int local_a8;
  int local_a4;
  long local_98;
  long local_90;
  int local_84;
  long local_78;
  long local_70;
  long local_58;
  long local_50;
  int local_44 [3];
  store_t local_37 [3];
  float local_34;
  float local_30;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *local_8;
  
  local_30 = in_XMM1_Da;
  if (in_XMM1_Da < 0.0) {
    local_30 = in_XMM0_Da;
  }
  local_34 = in_XMM2_Da;
  if (in_XMM2_Da < 0.0) {
    local_34 = in_XMM0_Da;
  }
  local_37[0] = (store_t)(int)in_XMM0_Da;
  local_37[1] = (store_t)(int)local_30;
  local_37[2] = (store_t)(int)local_34;
  local_44[1] = 3;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_44[0] = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth(in_RDI);
  piVar3 = std::min<int>(local_44 + 1,local_44);
  lVar4 = local_10;
  local_44[2] = *piVar3;
  local_50 = local_20 - local_10;
  local_58 = local_28 - local_18;
  if ((local_50 == 0) && (local_58 == 0)) {
    if ((((-1 < local_10) && (-1 < local_18)) &&
        (lVar6 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(local_8),
        lVar5 = local_18, lVar4 < lVar6)) &&
       (lVar4 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(local_8),
       lVar5 < lVar4)) {
      for (local_a8 = 0; local_a8 < local_44[2]; local_a8 = local_a8 + 1) {
        Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                  (local_8,local_10,local_18,local_a8,local_37[local_a8]);
      }
    }
  }
  else {
    iVar1 = std::abs((int)local_50);
    iVar2 = std::abs((int)local_58);
    if (CONCAT44(extraout_var_00,iVar2) < CONCAT44(extraout_var,iVar1)) {
      if (local_50 < 0) {
        local_78 = local_10;
        local_50 = -local_50;
        local_58 = -local_58;
        local_10 = local_20;
        local_18 = local_28;
      }
      else {
        local_78 = local_20;
      }
      local_70 = local_10;
      if (local_10 < 0) {
        local_70 = 0;
      }
      lVar4 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(local_8);
      if (lVar4 + -1 < local_78) {
        local_78 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(local_8);
        local_78 = local_78 + -1;
      }
      for (; local_70 <= local_78; local_70 = local_70 + 1) {
        lVar4 = local_18 + ((local_70 - local_10) * local_58) / local_50;
        if ((-1 < lVar4) &&
           (lVar5 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(local_8),
           lVar4 < lVar5)) {
          for (local_84 = 0; local_84 < local_44[2]; local_84 = local_84 + 1) {
            Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                      (local_8,local_70,lVar4,local_84,local_37[local_84]);
          }
        }
      }
    }
    else {
      if (local_58 < 0) {
        local_98 = local_18;
        local_50 = -local_50;
        local_58 = -local_58;
        local_10 = local_20;
        local_18 = local_28;
      }
      else {
        local_98 = local_28;
      }
      local_90 = local_18;
      if (local_18 < 0) {
        local_90 = 0;
      }
      lVar4 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(local_8);
      if (lVar4 + -1 < local_98) {
        local_98 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(local_8);
        local_98 = local_98 + -1;
      }
      for (; local_90 <= local_98; local_90 = local_90 + 1) {
        lVar4 = local_10 + ((local_90 - local_18) * local_50) / local_58;
        if ((-1 < lVar4) &&
           (lVar5 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(local_8),
           lVar4 < lVar5)) {
          for (local_a4 = 0; local_a4 < local_44[2]; local_a4 = local_a4 + 1) {
            Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                      (local_8,lVar4,local_90,local_a4,local_37[local_a4]);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void drawLine(Image<T> &image, long x1, long y1, long x2,
                                long y2, float r, float g=-1, float b=-1)
{
  T v[3];

  if (g < 0)
  {
    g=r;
  }

  if (b < 0)
  {
    b=r;
  }

  v[0]=static_cast<T>(r);
  v[1]=static_cast<T>(g);
  v[2]=static_cast<T>(b);

  int cn=std::min(3, image.getDepth());

  long dx=x2-x1;
  long dy=y2-y1;

  if (dx != 0 || dy != 0)
  {
    long adx=std::abs(dx);
    long ady=std::abs(dy);

    if (adx > ady)
    {
      long i, n;

      if (dx >= 0)
      {
        i=x1;
        n=x2;
      }
      else
      {
        i=x2;
        n=x1;
        dx=-dx;
        dy=-dy;
        x1=x2;
        y1=y2;
      }

      if (i < 0)
      {
        i=0;
      }

      if (n > image.getWidth()-1)
      {
        n=image.getWidth()-1;
      }

      while (i <= n)
      {
        long k=y1+(i-x1)*dy/dx;

        if (k >= 0 && k < image.getHeight())
        {
          for (int c=0; c<cn; c++)
          {
            image.set(i, k, c, v[c]);
          }
        }

        i++;
      }
    }
    else
    {
      long k, n;

      if (dy >= 0)
      {
        k=y1;
        n=y2;
      }
      else
      {
        k=y2;
        n=y1;
        dx=-dx;
        dy=-dy;
        x1=x2;
        y1=y2;
      }

      if (k < 0)
      {
        k=0;
      }

      if (n > image.getHeight()-1)
      {
        n=image.getHeight()-1;
      }

      while (k <= n)
      {
        long i=x1+(k-y1)*dx/dy;

        if (i >= 0 && i < image.getWidth())
        {
          for (int c=0; c<cn; c++)
          {
            image.set(i, k, c, v[c]);
          }
        }

        k++;
      }
    }
  }
  else
  {
    if (x1 >= 0 && y1 >= 0 && x1 < image.getWidth() && y1 < image.getHeight())
    {
      for (int c=0; c<cn; c++)
      {
        image.set(x1, y1, c, v[c]);
      }
    }
  }
}